

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

void nni_sha1_process(nni_sha1_ctx *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int t;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int t_1;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint32_t uVar13;
  uint uVar14;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [5];
  uint W [80];
  
  lVar6 = 8;
  do {
    uVar7 = ctx->digest[lVar6];
    auStack_198[lVar6] =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x18);
  lVar6 = 0x10;
  do {
    uVar7 = auStack_198[lVar6] ^ auStack_184[lVar6] ^ auStack_1b8[lVar6 + 2] ^ auStack_1b8[lVar6];
    auStack_184[lVar6 + 3] = uVar7 << 1 | (uint)((int)uVar7 < 0);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x50);
  uVar7 = ctx->digest[1];
  uVar1 = ctx->digest[2];
  uVar2 = ctx->digest[3];
  uVar3 = ctx->digest[4];
  lVar6 = 0;
  uVar13 = uVar3;
  uVar4 = uVar2;
  uVar10 = uVar1;
  uVar5 = uVar7;
  uVar11 = ctx->digest[0];
  do {
    uVar12 = uVar11;
    uVar9 = uVar10;
    uVar14 = uVar4;
    uVar11 = ((uVar9 ^ uVar14) & uVar5 ^ uVar14) + (uVar12 << 5 | uVar12 >> 0x1b) + uVar13 +
             auStack_184[lVar6 + 3] + 0x5a827999;
    uVar10 = uVar5 << 0x1e | uVar5 >> 2;
    lVar6 = lVar6 + 1;
    uVar13 = uVar14;
    uVar4 = uVar9;
    uVar5 = uVar12;
  } while (lVar6 != 0x14);
  lVar6 = 0x14;
  do {
    uVar5 = uVar9;
    uVar8 = uVar11;
    uVar9 = uVar10;
    uVar11 = (uVar9 ^ uVar12 ^ uVar5) + (uVar8 << 5 | uVar8 >> 0x1b) + uVar14 +
             auStack_184[lVar6 + 3] + 0x6ed9eba1;
    uVar10 = uVar12 << 0x1e | uVar12 >> 2;
    lVar6 = lVar6 + 1;
    uVar12 = uVar8;
    uVar14 = uVar5;
  } while (lVar6 != 0x28);
  lVar6 = 0x28;
  do {
    uVar12 = uVar9;
    uVar14 = uVar11;
    uVar9 = uVar10;
    uVar11 = auStack_184[lVar6 + 3] +
             (uVar12 & uVar9 | (uVar12 | uVar9) & uVar8) + (uVar14 << 5 | uVar14 >> 0x1b) + uVar5 +
             0x8f1bbcdc;
    uVar10 = uVar8 << 0x1e | uVar8 >> 2;
    lVar6 = lVar6 + 1;
    uVar5 = uVar12;
    uVar8 = uVar14;
  } while (lVar6 != 0x3c);
  lVar6 = 0x3c;
  do {
    uVar8 = uVar9;
    uVar5 = uVar11;
    uVar9 = uVar10;
    uVar11 = (uVar9 ^ uVar14 ^ uVar8) + (uVar5 << 5 | uVar5 >> 0x1b) + uVar12 +
             auStack_184[lVar6 + 3] + 0xca62c1d6;
    uVar10 = uVar14 << 0x1e | uVar14 >> 2;
    lVar6 = lVar6 + 1;
    uVar12 = uVar8;
    uVar14 = uVar5;
  } while (lVar6 != 0x50);
  ctx->digest[0] = uVar11 + ctx->digest[0];
  ctx->digest[1] = uVar5 + uVar7;
  ctx->digest[2] = uVar10 + uVar1;
  ctx->digest[3] = uVar9 + uVar2;
  ctx->digest[4] = uVar8 + uVar3;
  ctx->idx = 0;
  return;
}

Assistant:

void
nni_sha1_process(nni_sha1_ctx *ctx)
{
	const unsigned K[] = // Constants defined in SHA-1
	    { 0x5A827999, 0x6ED9EBA1, 0x8F1BBCDC, 0xCA62C1D6 };
	unsigned temp;          // Temporary word value
	unsigned W[80];         // Word sequence
	unsigned A, B, C, D, E; // Word buffers

	// Initialize the first 16 words in the array W
	for (int t = 0; t < 16; t++) {
		W[t] = ((unsigned) ctx->blk[t * 4]) << 24;
		W[t] |= ((unsigned) ctx->blk[t * 4 + 1]) << 16;
		W[t] |= ((unsigned) ctx->blk[t * 4 + 2]) << 8;
		W[t] |= ((unsigned) ctx->blk[t * 4 + 3]);
	}

	for (int t = 16; t < 80; t++) {
		W[t] = nni_sha1_circular_shift(
		    1, W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16]);
	}

	A = ctx->digest[0];
	B = ctx->digest[1];
	C = ctx->digest[2];
	D = ctx->digest[3];
	E = ctx->digest[4];

	for (int t = 0; t < 20; t++) {
		temp = nni_sha1_circular_shift(5, A) + ((B & C) | ((~B) & D)) +
		    E + W[t] + K[0];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	for (int t = 20; t < 40; t++) {
		temp = nni_sha1_circular_shift(5, A) + (B ^ C ^ D) + E + W[t] +
		    K[1];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	for (int t = 40; t < 60; t++) {
		temp = nni_sha1_circular_shift(5, A) +
		    ((B & C) | (B & D) | (C & D)) + E + W[t] + K[2];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	for (int t = 60; t < 80; t++) {
		temp = nni_sha1_circular_shift(5, A) + (B ^ C ^ D) + E + W[t] +
		    K[3];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	ctx->digest[0] = (ctx->digest[0] + A) & 0xFFFFFFFF;
	ctx->digest[1] = (ctx->digest[1] + B) & 0xFFFFFFFF;
	ctx->digest[2] = (ctx->digest[2] + C) & 0xFFFFFFFF;
	ctx->digest[3] = (ctx->digest[3] + D) & 0xFFFFFFFF;
	ctx->digest[4] = (ctx->digest[4] + E) & 0xFFFFFFFF;

	ctx->idx = 0;
}